

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::tessellation::anon_unknown_0::InvariantOuterEdge::OuterEdgeDivisionTestInstance::iterate
          (TestStatus *__return_storage_ptr__,OuterEdgeDivisionTestInstance *this)

{
  size_t *psVar1;
  size_type sVar2;
  const_reference edgeDesc_00;
  TestContext *pTVar3;
  TestLog *log_00;
  tessellation *this_00;
  const_reference pvVar4;
  MessageBuilder *pMVar5;
  tessellation *this_01;
  const_reference inner;
  float *outer;
  ulong uVar6;
  bool bVar7;
  pair<std::_Rb_tree_const_iterator<tcu::Vector<float,_3>_>,_bool> pVar8;
  bool local_5a1;
  allocator<char> local_569;
  string local_568;
  allocator<char> local_541;
  string local_540;
  string local_520;
  string local_500;
  MessageBuilder local_4e0;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  MessageBuilder local_2e0;
  TestLog *local_160;
  TestLog *log;
  undefined1 local_150;
  undefined1 local_144 [20];
  Vec3 *coord;
  undefined1 local_128 [4];
  int i;
  Vec3Set outerEdgeVertices;
  float *outerLevels;
  float *innerLevels;
  int patchNdx;
  int primitiveNdx;
  string local_d8;
  undefined1 local_b8 [8];
  DrawResult result;
  bool isFirstProgram;
  int iStack_84;
  bool usePointMode;
  Winding winding;
  int usePointModeNdx;
  int windingNdx;
  undefined1 local_70 [8];
  Vec3Set firstOuterEdgeVertices;
  vector<float,_std::allocator<float>_> patchTessLevels;
  OuterEdgeDescription *edgeDesc;
  int outerEdgeLevelCaseNdx;
  int outerEdgeIndex;
  OuterEdgeDivisionTestInstance *this_local;
  
  edgeDesc._4_4_ = 0;
  do {
    sVar2 = std::
            vector<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
            ::size(&(this->super_BaseTestInstance).m_edgeDescriptions);
    if ((int)sVar2 <= edgeDesc._4_4_) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_568,"OK",&local_569);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_568);
      std::__cxx11::string::~string((string *)&local_568);
      std::allocator<char>::~allocator(&local_569);
      return __return_storage_ptr__;
    }
    for (edgeDesc._0_4_ = 0; (int)edgeDesc < 0xc; edgeDesc._0_4_ = (int)edgeDesc + 1) {
      edgeDesc_00 = std::
                    vector<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
                    ::operator[](&(this->super_BaseTestInstance).m_edgeDescriptions,
                                 (long)edgeDesc._4_4_);
      generatePatchTessLevels
                ((vector<float,_std::allocator<float>_> *)
                 &firstOuterEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (this->super_BaseTestInstance).m_numPatchesToDraw,edgeDesc._4_4_,
                 *(float *)(tessellation::(anonymous_namespace)::InvariantOuterEdge::
                            BaseTestInstance::m_singleOuterEdgeLevels + (long)(int)edgeDesc * 4));
      std::
      set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
      ::set((set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
             *)local_70);
      BaseTestInstance::uploadVertexAttributes
                (&this->super_BaseTestInstance,
                 (vector<float,_std::allocator<float>_> *)
                 &firstOuterEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count);
      pTVar3 = Context::getTestContext((this->super_BaseTestInstance).super_TestInstance.m_context);
      log_00 = tcu::TestContext::getLog(pTVar3);
      logOuterTessellationLevel
                (log_00,*(float *)(tessellation::(anonymous_namespace)::InvariantOuterEdge::
                                   BaseTestInstance::m_singleOuterEdgeLevels +
                                  (long)(int)edgeDesc * 4),edgeDesc_00);
      for (winding = WINDING_CCW; (int)winding < 2; winding = winding + WINDING_CW) {
        for (iStack_84 = 0; iStack_84 < 2; iStack_84 = iStack_84 + 1) {
          result.primitives.
          super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = iStack_84 != 0;
          local_5a1 = winding == WINDING_CCW && iStack_84 == 0;
          result.primitives.
          super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = local_5a1;
          psVar1 = &firstOuterEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count;
          sVar2 = std::vector<float,_std::allocator<float>_>::size
                            ((vector<float,_std::allocator<float>_> *)psVar1);
          uVar6 = (ulong)winding;
          BaseTestInstance::draw
                    ((DrawResult *)local_b8,&this->super_BaseTestInstance,(deUint32)sVar2,
                     (vector<float,_std::allocator<float>_> *)psVar1,winding,
                     (bool)(result.primitives.
                            super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
          if ((local_b8[0] & 1U) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_d8,"Invalid set of vertices",
                       (allocator<char> *)((long)&primitiveNdx + 3));
            tcu::TestStatus::fail(__return_storage_ptr__,&local_d8);
            std::__cxx11::string::~string((string *)&local_d8);
            std::allocator<char>::~allocator((allocator<char> *)((long)&primitiveNdx + 3));
            bVar7 = true;
          }
          else {
            innerLevels._4_4_ = 0;
            for (innerLevels._0_4_ = 0;
                (int)innerLevels < (this->super_BaseTestInstance).m_numPatchesToDraw;
                innerLevels._0_4_ = (int)innerLevels + 1) {
              psVar1 = &firstOuterEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count;
              this_00 = (tessellation *)
                        std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)psVar1,
                                   (long)((int)innerLevels * 6));
              outerEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count =
                   (size_t)std::vector<float,_std::allocator<float>_>::operator[]
                                     ((vector<float,_std::allocator<float>_> *)psVar1,
                                      (long)((int)innerLevels * 6 + 2));
              std::
              set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
              ::set((set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     *)local_128);
              while( true ) {
                outer = (float *)(ulong)innerLevels._4_4_;
                bVar7 = false;
                if ((int)innerLevels._4_4_ < result.refNumPrimitives) {
                  pvVar4 = std::
                           vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                           ::operator[]((vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                         *)&result.numPrimitiveVertices,(long)(int)innerLevels._4_4_
                                       );
                  bVar7 = pvVar4->patchPrimitiveID == (int)innerLevels;
                }
                if (!bVar7) break;
                for (coord._4_4_ = 0; coord._4_4_ < (int)result._0_4_; coord._4_4_ = coord._4_4_ + 1
                    ) {
                  pvVar4 = std::
                           vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                           ::operator[]((vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                         *)&result.numPrimitiveVertices,(long)(int)innerLevels._4_4_
                                       );
                  uVar6 = 2;
                  tcu::Vector<float,_4>::swizzle
                            ((Vector<float,_4> *)local_144,(int)pvVar4 + 0x10 + coord._4_4_ * 0x10,0
                             ,1);
                  local_144._12_8_ = local_144;
                  bVar7 = OuterEdgeDescription::contains(edgeDesc_00,(Vec3 *)local_144._12_8_);
                  if (bVar7) {
                    pVar8 = std::
                            set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                            ::insert((set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                      *)local_128,(value_type *)local_144._12_8_);
                    log = (TestLog *)pVar8.first._M_node;
                    local_150 = pVar8.second;
                  }
                }
                innerLevels._4_4_ = innerLevels._4_4_ + 1;
              }
              if (((result.primitives.
                    super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) == 0) ||
                 ((int)innerLevels != 0)) {
                bVar7 = std::operator!=((set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                         *)local_70,
                                        (set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                         *)local_128);
                if (!bVar7) goto LAB_00dcf815;
                pTVar3 = Context::getTestContext
                                   ((this->super_BaseTestInstance).super_TestInstance.m_context);
                local_160 = tcu::TestContext::getLog(pTVar3);
                tcu::TestLog::operator<<
                          (&local_2e0,local_160,(BeginMessageToken *)&tcu::TestLog::Message);
                pMVar5 = tcu::MessageBuilder::operator<<
                                   (&local_2e0,
                                    (char (*) [78])
                                    "Failure: vertices generated for the edge differ between the following cases:\n"
                                   );
                pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [13])"  - case A: ");
                tessellation::(anonymous_namespace)::getProgramDescription_abi_cxx11_
                          (&local_300,(_anonymous_namespace_ *)0x0,WINDING_CCW,SUB81(outer,0));
                pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_300);
                pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [24])0x133de06);
                psVar1 = &firstOuterEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count;
                this_01 = (tessellation *)
                          std::vector<float,_std::allocator<float>_>::operator[]
                                    ((vector<float,_std::allocator<float>_> *)psVar1,0);
                inner = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)psVar1,2);
                getTessellationLevelsString_abi_cxx11_(&local_320,this_01,inner,outer);
                pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_320);
                pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x134b284);
                pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [13])"  - case B: ");
                tessellation::(anonymous_namespace)::getProgramDescription_abi_cxx11_
                          (&local_340,(_anonymous_namespace_ *)(ulong)winding,
                           result.primitives.
                           super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & WINDING_CW,
                           SUB81(outer,0));
                pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_340);
                pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [24])0x133de06);
                getTessellationLevelsString_abi_cxx11_
                          (&local_360,this_00,
                           (float *)outerEdgeVertices._M_t._M_impl.super__Rb_tree_header.
                                    _M_node_count,outer);
                pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_360);
                tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::string::~string((string *)&local_360);
                std::__cxx11::string::~string((string *)&local_340);
                std::__cxx11::string::~string((string *)&local_320);
                std::__cxx11::string::~string((string *)&local_300);
                tcu::MessageBuilder::~MessageBuilder(&local_2e0);
                tcu::TestLog::operator<<
                          (&local_4e0,local_160,(BeginMessageToken *)&tcu::TestLog::Message);
                pMVar5 = tcu::MessageBuilder::operator<<
                                   (&local_4e0,
                                    (char (*) [59])
                                    "Note: resulting vertices for the edge for the cases were:\n");
                pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [13])"  - case A: ");
                containerStr<std::set<tcu::Vector<float,3>,vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                          (&local_500,(tessellation *)local_70,
                           (set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                            *)0x5,0xe,(int)uVar6);
                pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_500);
                pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x134b284);
                pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [13])"  - case B: ");
                containerStr<std::set<tcu::Vector<float,3>,vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                          (&local_520,(tessellation *)local_128,
                           (set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                            *)0x5,0xe,(int)uVar6);
                pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_520);
                tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::string::~string((string *)&local_520);
                std::__cxx11::string::~string((string *)&local_500);
                tcu::MessageBuilder::~MessageBuilder(&local_4e0);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_540,"Invalid set of vertices",&local_541);
                tcu::TestStatus::fail(__return_storage_ptr__,&local_540);
                std::__cxx11::string::~string((string *)&local_540);
                std::allocator<char>::~allocator(&local_541);
                bVar7 = true;
              }
              else {
                std::
                set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                ::operator=((set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_70,
                            (set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             *)local_128);
LAB_00dcf815:
                bVar7 = false;
              }
              std::
              set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
              ::~set((set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      *)local_128);
              if (bVar7) goto LAB_00dcf865;
            }
            bVar7 = false;
          }
LAB_00dcf865:
          BaseTestInstance::DrawResult::~DrawResult((DrawResult *)local_b8);
          if (bVar7) goto LAB_00dcf8b5;
        }
      }
      bVar7 = false;
LAB_00dcf8b5:
      std::
      set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
      ::~set((set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
              *)local_70);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)
                 &firstOuterEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (bVar7) {
        return __return_storage_ptr__;
      }
    }
    edgeDesc._4_4_ = edgeDesc._4_4_ + 1;
  } while( true );
}

Assistant:

tcu::TestStatus OuterEdgeDivisionTestInstance::iterate (void)
{
	for (int outerEdgeIndex = 0; outerEdgeIndex < static_cast<int>(m_edgeDescriptions.size()); ++outerEdgeIndex)
	for (int outerEdgeLevelCaseNdx = 0; outerEdgeLevelCaseNdx < DE_LENGTH_OF_ARRAY(m_singleOuterEdgeLevels); ++outerEdgeLevelCaseNdx)
	{
		const OuterEdgeDescription& edgeDesc        = m_edgeDescriptions[outerEdgeIndex];
		const std::vector<float>    patchTessLevels = generatePatchTessLevels(m_numPatchesToDraw, outerEdgeIndex, m_singleOuterEdgeLevels[outerEdgeLevelCaseNdx]);

		Vec3Set firstOuterEdgeVertices; // Vertices of the outer edge of the first patch of the first program's draw call; used for comparison with other patches.

		uploadVertexAttributes(patchTessLevels);
		logOuterTessellationLevel(m_context.getTestContext().getLog(), m_singleOuterEdgeLevels[outerEdgeLevelCaseNdx], edgeDesc);

		for (int windingNdx = 0; windingNdx < WINDING_LAST; ++windingNdx)
		for (int usePointModeNdx = 0; usePointModeNdx <= 1; ++usePointModeNdx)
		{
			const Winding winding	     = static_cast<Winding>(windingNdx);
			const bool	  usePointMode   = (usePointModeNdx != 0);
			const bool    isFirstProgram = (windingNdx == 0 && usePointModeNdx == 0);

			const DrawResult result = draw(static_cast<deUint32>(patchTessLevels.size()), patchTessLevels, winding, usePointMode);

			if (!result.success)
				return tcu::TestStatus::fail("Invalid set of vertices");

			// Check the vertices of each patch.

			int primitiveNdx = 0;
			for (int patchNdx = 0; patchNdx < m_numPatchesToDraw; ++patchNdx)
			{
				DE_ASSERT(primitiveNdx < result.numPrimitives);

				const float* const	innerLevels	= &patchTessLevels[NUM_TESS_LEVELS*patchNdx + 0];
				const float* const	outerLevels	= &patchTessLevels[NUM_TESS_LEVELS*patchNdx + 2];

				Vec3Set outerEdgeVertices;

				// We're interested in just the vertices on the current outer edge.
				for (; primitiveNdx < result.numPrimitives && result.primitives[primitiveNdx].patchPrimitiveID == patchNdx; ++primitiveNdx)
				for (int i = 0; i < result.numPrimitiveVertices; ++i)
				{
					const tcu::Vec3& coord = result.primitives[primitiveNdx].tessCoord[i].swizzle(0, 1, 2);
					if (edgeDesc.contains(coord))
						outerEdgeVertices.insert(coord);
				}

				// Compare the vertices to those of the first patch (unless this is the first patch).

				if (isFirstProgram && patchNdx == 0)
					firstOuterEdgeVertices = outerEdgeVertices;
				else if (firstOuterEdgeVertices != outerEdgeVertices)
				{
					tcu::TestLog& log = m_context.getTestContext().getLog();

					log << tcu::TestLog::Message
						<< "Failure: vertices generated for the edge differ between the following cases:\n"
						<< "  - case A: " << getProgramDescription((Winding)0, (bool)0) << ", tessellation levels: "
						<< getTessellationLevelsString(&patchTessLevels[0], &patchTessLevels[2]) << "\n"
						<< "  - case B: " << getProgramDescription(winding, usePointMode) << ", tessellation levels: "
						<< getTessellationLevelsString(innerLevels, outerLevels)
						<< tcu::TestLog::EndMessage;

					log << tcu::TestLog::Message
						<< "Note: resulting vertices for the edge for the cases were:\n"
						<< "  - case A: " << containerStr(firstOuterEdgeVertices, 5, 14) << "\n"
						<< "  - case B: " << containerStr(outerEdgeVertices, 5, 14)
						<< tcu::TestLog::EndMessage;

					return tcu::TestStatus::fail("Invalid set of vertices");
				}
			}
			DE_ASSERT(primitiveNdx == result.numPrimitives);
		} // for windingNdx, usePointModeNdx
	} // for outerEdgeIndex, outerEdgeLevelCaseNdx

	return tcu::TestStatus::pass("OK");
}